

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void fail_if_leftover_values(char *test_name)

{
  ListNode *head;
  undefined8 *puVar1;
  ListNode *node;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  ListNode *pLVar5;
  int quit_application;
  long lVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  
  lVar6 = *in_FS_OFFSET;
  remove_always_return_values((ListNode *)(lVar6 + -400),1);
  sVar3 = check_for_leftover_values
                    ((ListNode *)(lVar6 + -400),"%s() has remaining non-returned values.\n",1);
  remove_always_return_values((ListNode *)(lVar6 + -0x140),2);
  sVar4 = check_for_leftover_values
                    ((ListNode *)(lVar6 + -0x140),
                     "\'%s\' parameter still has values that haven\'t been checked.\n",2);
  bVar7 = sVar4 == 0;
  head = (ListNode *)(lVar6 + -0x160);
  pLVar5 = *(ListNode **)(lVar6 + -0x150);
  while (node = pLVar5, node != head) {
    pLVar5 = node->next;
    if (node->refcount < -1) {
      list_remove_free(node,free_value,(void *)0x0);
    }
  }
  pLVar5 = head;
  iVar2 = list_empty(head);
  quit_application = (int)pLVar5;
  pLVar5 = *(ListNode **)(lVar6 + -0x150);
  if (pLVar5 != head && iVar2 == 0) {
    lVar6 = 0;
    do {
      puVar1 = (undefined8 *)pLVar5->value;
      cm_print_error("%s function was expected to be called but was not.\n","%s",puVar1[2]);
      quit_application = 0x10fb4f;
      cm_print_error("%s:%u: note: remaining item was declared here\n",*puVar1,
                     (ulong)*(uint *)(puVar1 + 1));
      pLVar5 = pLVar5->next;
      lVar6 = lVar6 + -1;
    } while (pLVar5 != head);
    bVar7 = lVar6 == 0 && sVar4 == 0;
  }
  if ((bVar7) && (sVar3 == 0)) {
    return;
  }
  exit_test(quit_application);
}

Assistant:

static void fail_if_leftover_values(const char *test_name) {
    int error_occurred = 0;
    (void)test_name;
    remove_always_return_values(&global_function_result_map_head, 1);
    if (check_for_leftover_values(
            &global_function_result_map_head,
            "%s() has remaining non-returned values.\n", 1)) {
        error_occurred = 1;
    }

    remove_always_return_values(&global_function_parameter_map_head, 2);
    if (check_for_leftover_values(
            &global_function_parameter_map_head,
            "'%s' parameter still has values that haven't been checked.\n",
            2)) {
        error_occurred = 1;
    }

    remove_always_return_values_from_list(&global_call_ordering_head);
    if (check_for_leftover_values_list(&global_call_ordering_head,
        "%s function was expected to be called but was not.\n")) {
        error_occurred = 1;
    }
    if (error_occurred) {
        exit_test(1);
    }
}